

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void setResultStrOrError(sqlite3_context *pCtx,char *z,int n,u8 enc,_func_void_void_ptr *xDel)

{
  Mem *pMem;
  int iVar1;
  int rc;
  Mem *pOut;
  _func_void_void_ptr *xDel_local;
  u8 enc_local;
  int n_local;
  char *z_local;
  sqlite3_context *pCtx_local;
  
  pMem = pCtx->pOut;
  iVar1 = sqlite3VdbeMemSetStr(pMem,z,(long)n,enc,xDel);
  if (iVar1 == 0) {
    sqlite3VdbeChangeEncoding(pMem,(uint)pCtx->enc);
    iVar1 = sqlite3VdbeMemTooBig(pMem);
    if (iVar1 != 0) {
      sqlite3_result_error_toobig(pCtx);
    }
  }
  else if (iVar1 == 0x12) {
    sqlite3_result_error_toobig(pCtx);
  }
  else {
    sqlite3_result_error_nomem(pCtx);
  }
  return;
}

Assistant:

static void setResultStrOrError(
  sqlite3_context *pCtx,  /* Function context */
  const char *z,          /* String pointer */
  int n,                  /* Bytes in string, or negative */
  u8 enc,                 /* Encoding of z.  0 for BLOBs */
  void (*xDel)(void*)     /* Destructor function */
){
  Mem *pOut = pCtx->pOut;
  int rc = sqlite3VdbeMemSetStr(pOut, z, n, enc, xDel);
  if( rc ){
    if( rc==SQLITE_TOOBIG ){
      sqlite3_result_error_toobig(pCtx);
    }else{
      /* The only errors possible from sqlite3VdbeMemSetStr are
      ** SQLITE_TOOBIG and SQLITE_NOMEM */
      assert( rc==SQLITE_NOMEM );
      sqlite3_result_error_nomem(pCtx);
    }
    return;
  }
  sqlite3VdbeChangeEncoding(pOut, pCtx->enc);
  if( sqlite3VdbeMemTooBig(pOut) ){
    sqlite3_result_error_toobig(pCtx);
  }
}